

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O0

char * Am_Check_Int_Type(Am_Value *value)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  Am_Value *value_local;
  
  if ((value->type != 2) && (bVar1 = Am_Value::Safe(value), bVar1)) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "** Amulet error, Expected int type in Object but got ");
    poVar2 = operator<<(poVar2,value);
    this = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
    return "int type check error";
  }
  return (char *)0x0;
}

Assistant:

const char *
Am_Check_Int_Type(const Am_Value &value)
{
  if (value.type == Am_INT || !value.Safe())
    return nullptr;
  else {
    std::cerr << "** Amulet error, Expected int type in Object but got "
              << value << std::endl
              << std::flush;
    return "int type check error";
  }
}